

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymul.hpp
# Opt level: O0

void polymul_internal::taylor_inplace_multiplier<double,_1,_4,_4,_0>::mul(double *p1,double *p2)

{
  int local_1c;
  int i;
  double *p2_local;
  double *p1_local;
  
  p1[4] = *p2 * p1[4];
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    p1[4] = p1[local_1c] * p2[4 - local_1c] + p1[4];
  }
  taylor_inplace_multiplier<double,_1,_3,_4,_0>::mul(p1,p2);
  return;
}

Assistant:

static void mul(numtype POLYMUL_RESTRICT p1[], const numtype p2[]) {
    p1[Ndeg] *= p2[0];
    if (Ndeg <= Ndeg2) {
      for (int i = 0; i < Ndeg; i++)
        p1[Ndeg] += p1[i] * p2[Ndeg - i];
    } else {
      for (int i = Ndeg - Ndeg2; i < Ndeg; i++)
        p1[Ndeg] += p1[i] * p2[Ndeg - i];
    }
    taylor_inplace_multiplier<numtype, 1, Ndeg - 1, Ndeg2, 0>::mul(p1, p2);
  }